

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.c
# Opt level: O0

int lws_http_date_parse(char *b,size_t len,tm *tm)

{
  int iVar1;
  int local_2c;
  int n;
  tm *tm_local;
  size_t len_local;
  char *b_local;
  
  if (len < 0x1d) {
    b_local._4_4_ = -1;
  }
  else if (((((((b[3] == ',') && (b[4] == ' ')) && (b[7] == ' ')) &&
             ((b[0xb] == ' ' && (b[0x10] == ' ')))) &&
            ((b[0x13] == ':' && ((b[0x16] == ':' && (b[0x19] == ' ')))))) && (b[0x1a] == 'G')) &&
          ((b[0x1b] == 'M' && (b[0x1c] == 'T')))) {
    memset(tm,0,0x38);
    local_2c = 0x24;
    while ((local_2c < 0x39 &&
           (((*b != "JanFebMarAprMayJunJulAugSepOctNovDecMonTueWedThuFriSatSun"[local_2c] ||
             (b[1] != "JanFebMarAprMayJunJulAugSepOctNovDecMonTueWedThuFriSatSun"[local_2c + 1])) ||
            (b[2] != "JanFebMarAprMayJunJulAugSepOctNovDecMonTueWedThuFriSatSun"[local_2c + 2])))))
    {
      tm->tm_wday = tm->tm_wday + 1;
      local_2c = local_2c + 3;
    }
    if (local_2c == 0x39) {
      b_local._4_4_ = -1;
    }
    else {
      local_2c = 0;
      while ((local_2c < 0x24 &&
             (((b[8] != "JanFebMarAprMayJunJulAugSepOctNovDecMonTueWedThuFriSatSun"[local_2c] ||
               (b[9] != "JanFebMarAprMayJunJulAugSepOctNovDecMonTueWedThuFriSatSun"[local_2c + 1]))
              || (b[10] != "JanFebMarAprMayJunJulAugSepOctNovDecMonTueWedThuFriSatSun"[local_2c + 2]
                 ))))) {
        tm->tm_mon = tm->tm_mon + 1;
        local_2c = local_2c + 3;
      }
      if (local_2c == 0x24) {
        b_local._4_4_ = -1;
      }
      else {
        iVar1 = atoi(b + 5);
        tm->tm_mday = iVar1;
        iVar1 = atoi(b + 0xc);
        if (iVar1 < 0x76c) {
          b_local._4_4_ = -1;
        }
        else {
          tm->tm_year = iVar1 + -0x76c;
          iVar1 = atoi(b + 0x11);
          if ((iVar1 < 0) || (0x17 < iVar1)) {
            b_local._4_4_ = -1;
          }
          else {
            tm->tm_hour = iVar1;
            iVar1 = atoi(b + 0x14);
            if ((iVar1 < 0) || (0x3c < iVar1)) {
              b_local._4_4_ = -1;
            }
            else {
              tm->tm_min = iVar1;
              iVar1 = atoi(b + 0x17);
              if ((iVar1 < 0) || (0x3d < iVar1)) {
                b_local._4_4_ = -1;
              }
              else {
                tm->tm_sec = iVar1;
                b_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  else {
    b_local._4_4_ = -1;
  }
  return b_local._4_4_;
}

Assistant:

static int
lws_http_date_parse(const char *b, size_t len, struct tm *tm)
{
	int n;

	if (len < 29)
		return -1;

	/*
	 * We reject anything that isn't a properly-formatted RFC7231 date, eg
	 *
	 *     Tue, 15 Nov 1994 08:12:31 GMT
	 */

	if (b[3] != ','  || b[4] != ' '  || b[7] != ' '  || b[11] != ' ' ||
	    b[16] != ' ' || b[19] != ':' || b[22] != ':' || b[25] != ' ' ||
	    b[26] != 'G' || b[27] != 'M' || b[28] != 'T')
		return -1;

	memset(tm, 0, sizeof(*tm));

	for (n = 36; n < 57; n += 3)
		if (b[0] == s[n] && b[1] == s[n + 1] && b[2] == s[n + 2])
			break;
		else
			tm->tm_wday++;

	if (n == 57)
		return -1;

	for (n = 0; n < 36; n += 3)
		if (b[8] == s[n] && b[9] == s[n + 1] && b[10] == s[n + 2])
			break;
		else
			tm->tm_mon++;

	if (n == 36)
		return -1;

	tm->tm_mday = atoi(b + 5);
	n = atoi(b + 12);
	if (n < 1900)
		return -1;
	tm->tm_year = n - 1900;

	n = atoi(b + 17);
	if (n < 0 || n > 23)
		return -1;
	tm->tm_hour = n;

	n = atoi(b + 20);
	if (n < 0 || n > 60)
		return -1;
	tm->tm_min = n;

	n = atoi(b + 23);
	if (n < 0 || n > 61) /* leap second */
		return -1;
	tm->tm_sec = n;

	return 0;
}